

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O0

bool __thiscall
anurbs::TypeEntry<anurbs::BrepEdge,_anurbs::Model>::save
          (TypeEntry<anurbs::BrepEdge,_anurbs::Model> *this,Model *model,size_t index,Json *target)

{
  bool bVar1;
  BrepEdge *data;
  element_type *this_00;
  bool local_89;
  Ref<anurbs::BrepEdge> local_78;
  undefined4 local_68;
  byte local_61;
  Ref<anurbs::BrepEdge> local_60 [2];
  undefined1 local_40 [8];
  Ref<anurbs::BrepEdge> entry;
  Json *target_local;
  size_t index_local;
  Model *model_local;
  TypeEntry<anurbs::BrepEdge,_anurbs::Model> *this_local;
  
  entry.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)target;
  Model::get<anurbs::BrepEdge>((Model *)local_40,(size_t)model);
  local_61 = 0;
  bVar1 = Ref<anurbs::BrepEdge>::is_empty((Ref<anurbs::BrepEdge> *)local_40);
  local_89 = true;
  if (!bVar1) {
    Ref<anurbs::BrepEdge>::data(local_60);
    local_61 = 1;
    local_89 = std::operator==((shared_ptr<anurbs::BrepEdge> *)local_60,(nullptr_t)0x0);
  }
  if ((local_61 & 1) != 0) {
    std::shared_ptr<anurbs::BrepEdge>::~shared_ptr((shared_ptr<anurbs::BrepEdge> *)local_60);
  }
  if (local_89 == false) {
    data = Ref<anurbs::BrepEdge>::operator*((Ref<anurbs::BrepEdge> *)local_40);
    BrepEdge::save(model,data,
                   (Json *)entry.m_entry.
                           super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
    Ref<anurbs::BrepEdge>::attributes(&local_78);
    this_00 = std::__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_78);
    Attributes::
    save<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (this_00,model,
               (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)entry.m_entry.
                  super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
    std::shared_ptr<anurbs::Attributes>::~shared_ptr((shared_ptr<anurbs::Attributes> *)&local_78);
  }
  local_68 = 1;
  Ref<anurbs::BrepEdge>::~Ref((Ref<anurbs::BrepEdge> *)local_40);
  return local_89 == false;
}

Assistant:

bool save(const TModel& model, const size_t index, Json& target) override
    {
        const auto entry = model.template get<TData>(index);

        if (entry.is_empty() || entry.data() == nullptr) {
            return false;
        }

        TData::save(model, *entry, target);
        entry.attributes()->save(model, target);

        return true;
    }